

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void hta::throw_exception<hta::MissingMetricConfig,char_const*,std::__cxx11::string>
               (char *args,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1
               )

{
  pointer pcVar1;
  runtime_error *this;
  stringstream msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  make_exception<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8 [32];
  stringstream local_1a8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  pcVar1 = (args_1->_M_dataplus)._M_p;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar1,pcVar1 + args_1->_M_string_length);
  detail::
  make_exception<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator()(local_1c8,(stringstream *)local_1a8,args,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,(string *)local_1c8);
  *(undefined ***)this = &PTR__runtime_error_00122b10;
  __cxa_throw(this,&MissingMetricConfig::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] inline void throw_exception(Args... args)
{
    std::stringstream msg;

    detail::make_exception<Args...>()(msg, args...);

    throw E(msg.str());
}